

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

TapBranch * __thiscall
cfd::core::TapBranch::ChangeTapLeaf
          (TapBranch *__return_storage_ptr__,TapBranch *this,Script *tapscript,
          vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *target_nodes)

{
  pointer pTVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  CfdException *pCVar5;
  pointer pBVar6;
  TapBranch *this_00;
  pointer pBVar7;
  size_t idx;
  ulong uVar8;
  size_t index;
  long lVar9;
  long lVar10;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> check_nodes;
  ulong local_200;
  Script *local_1f8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> reverse_nodes;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> branch_nodes;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> new_branches;
  vector<unsigned_long,_std::allocator<unsigned_long>_> target_branch_indexes;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> checked_nodes_size_list;
  string check_nodes_str;
  string reverse_nodes_str;
  string hex;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> local_48;
  
  local_1f8 = tapscript;
  bVar3 = IsFindTapScript(this,tapscript);
  if (!bVar3) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&check_nodes_str,"This tapscript not exist in this tree.",(allocator *)&hex
              );
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&check_nodes_str);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  (*this->_vptr_TapBranch[4])(&nodes,this);
  if (((this->has_leaf_ == true) && (bVar3 = Script::Equals(&this->script_,local_1f8), bVar3)) &&
     (((target_nodes->
       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>)._M_impl.
       super__Vector_impl_data._M_start ==
       (target_nodes->
       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>)._M_impl.
       super__Vector_impl_data._M_finish || (bVar3 = ::std::operator==(target_nodes,&nodes), bVar3))
     )) {
    TapBranch(__return_storage_ptr__,this);
  }
  else {
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
              (&reverse_nodes,target_nodes);
    pBVar6 = reverse_nodes.
             super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (reverse_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_start !=
        reverse_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ::std::
      __reverse<__gnu_cxx::__normal_iterator<cfd::core::ByteData256*,std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>>>
                (reverse_nodes.
                 super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pBVar6 = reverse_nodes.
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    reverse_nodes_str._M_dataplus._M_p = (pointer)&reverse_nodes_str.field_2;
    reverse_nodes_str._M_string_length = 0;
    reverse_nodes_str.field_2._M_local_buf[0] = '\0';
    for (pBVar7 = reverse_nodes.
                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                  ._M_impl.super__Vector_impl_data._M_start; pBVar7 != pBVar6; pBVar7 = pBVar7 + 1)
    {
      ByteData256::GetHex_abi_cxx11_(&check_nodes_str,pBVar7);
      ::std::__cxx11::string::append((string *)&reverse_nodes_str);
      ::std::__cxx11::string::~string((string *)&check_nodes_str);
    }
    target_branch_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    checked_nodes_size_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    target_branch_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    target_branch_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    new_branches.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    checked_nodes_size_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    checked_nodes_size_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    new_branches.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_branches.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_200 = 0;
    while( true ) {
      pTVar1 = (this->branch_list_).
               super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->branch_list_).
                         super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x78) <=
          local_200) break;
      this_00 = pTVar1 + local_200;
      bVar3 = IsFindTapScript(this_00,local_1f8);
      if (bVar3) {
        check_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        check_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        check_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (reverse_nodes.
            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            reverse_nodes.
            super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&target_branch_indexes,
                     &local_200);
          check_nodes_str._M_dataplus._M_p = check_nodes_str._M_dataplus._M_p & 0xffffffff00000000;
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<int>
                    (&checked_nodes_size_list,(int *)&check_nodes_str);
        }
        else {
          (*this_00->_vptr_TapBranch[4])(&branch_nodes,this_00);
          uVar4 = ((long)nodes.
                         super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)nodes.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x18;
          lVar10 = uVar4 * 0x18;
          while( true ) {
            uVar4 = uVar4 - 1;
            if (uVar4 <= local_200) break;
            ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
            emplace_back<cfd::core::ByteData256&>
                      ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                       &check_nodes,
                       (ByteData256 *)
                       ((long)&nodes.
                               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar10));
            lVar10 = lVar10 + -0x18;
          }
          if (local_200 == 0) {
            GetBaseHash((ByteData256 *)&check_nodes_str,this);
            ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
            emplace_back<cfd::core::ByteData256>(&check_nodes,(ByteData256 *)&check_nodes_str);
          }
          else {
            GetBranchHash((ByteData256 *)&check_nodes_str,this,(char)local_200 + 0xff);
            ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
            emplace_back<cfd::core::ByteData256>(&check_nodes,(ByteData256 *)&check_nodes_str);
          }
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&check_nodes_str
                    );
          pBVar6 = check_nodes.
                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          check_nodes_str._M_dataplus._M_p = (pointer)&check_nodes_str.field_2;
          check_nodes_str._M_string_length = 0;
          check_nodes_str.field_2._M_local_buf[0] = '\0';
          for (pBVar7 = check_nodes.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_start; pBVar7 != pBVar6;
              pBVar7 = pBVar7 + 1) {
            ByteData256::GetHex_abi_cxx11_(&hex,pBVar7);
            ::std::__cxx11::string::append((string *)&check_nodes_str);
            ::std::__cxx11::string::~string((string *)&hex);
          }
          uVar4 = 0xffffffffffffffff;
          lVar10 = 0;
          do {
            uVar4 = uVar4 + 1;
            if ((ulong)(((long)check_nodes.
                               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)check_nodes.
                              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar4) {
              ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
              emplace_back<unsigned_long&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                         &target_branch_indexes,&local_200);
              hex._M_dataplus._M_p =
                   (pointer)(((long)check_nodes.
                                    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)check_nodes.
                                   super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x18);
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>(&checked_nodes_size_list,(unsigned_long *)&hex);
              break;
            }
            bVar3 = ByteData256::Equals((ByteData256 *)
                                        ((long)&((reverse_nodes.
                                                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data_)
                                                .
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar10),
                                        (ByteData256 *)
                                        ((long)&((check_nodes.
                                                  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data_)
                                                .
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar10))
            ;
            lVar10 = lVar10 + 0x18;
          } while (bVar3);
          ::std::__cxx11::string::~string((string *)&check_nodes_str);
          ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    (&branch_nodes);
        }
        ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&check_nodes);
      }
      local_200 = local_200 + 1;
    }
    for (uVar4 = 0;
        puVar2 = target_branch_indexes.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)target_branch_indexes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)target_branch_indexes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      check_nodes.
      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      check_nodes.
      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      check_nodes.
      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pBVar6 = (target_nodes->
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pBVar7 = (target_nodes->
               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pBVar6 != pBVar7) {
        lVar9 = ((long)pBVar7 - (long)pBVar6) / 0x18 -
                checked_nodes_size_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        lVar10 = 0;
        while (bVar3 = lVar9 != 0, lVar9 = lVar9 + -1, bVar3) {
          ::std::vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>>::
          emplace_back<cfd::core::ByteData256_const&>
                    ((vector<cfd::core::ByteData256,std::allocator<cfd::core::ByteData256>> *)
                     &check_nodes,
                     (ByteData256 *)
                     ((long)&(((target_nodes->
                               super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                               )._M_impl.super__Vector_impl_data._M_start)->data_).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar10));
          lVar10 = lVar10 + 0x18;
        }
      }
      ChangeTapLeaf((TapBranch *)&check_nodes_str,
                    (this->branch_list_).
                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                    _M_impl.super__Vector_impl_data._M_start + puVar2[uVar4],local_1f8,&check_nodes)
      ;
      GetBaseHash((ByteData256 *)&hex,(TapBranch *)&check_nodes_str);
      bVar3 = ByteData256::IsEmpty((ByteData256 *)&hex);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hex);
      if (!bVar3) {
        TapBranch((TapBranch *)&hex,this);
        branch_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        branch_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        branch_nodes.
        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        lVar10 = 0;
        for (uVar8 = 0; uVar8 < puVar2[uVar4]; uVar8 = uVar8 + 1) {
          ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
          emplace_back<cfd::core::TapBranch_const&>
                    ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)
                     &branch_nodes,
                     (TapBranch *)
                     ((long)&((this->branch_list_).
                              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_vptr_TapBranch + lVar10))
          ;
          lVar10 = lVar10 + 0x78;
        }
        ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
                  (&local_48,
                   (vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                   &branch_nodes);
        AddBranch((TapBranch *)&check_nodes_str,(TapBranch *)&hex);
        uVar8 = puVar2[uVar4];
        lVar10 = uVar8 * 0x78;
        while( true ) {
          uVar8 = uVar8 + 1;
          pTVar1 = (this->branch_list_).
                   super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(this->branch_list_).
                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x78) <=
              uVar8) break;
          AddBranch((TapBranch *)&check_nodes_str,
                    (TapBranch *)((long)&pTVar1[1]._vptr_TapBranch + lVar10));
          lVar10 = lVar10 + 0x78;
        }
        ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
        emplace_back<cfd::core::TapBranch&>
                  ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)
                   &new_branches,(TapBranch *)&check_nodes_str);
        ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
                  ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                   &branch_nodes);
        ~TapBranch((TapBranch *)&hex);
      }
      ~TapBranch((TapBranch *)&check_nodes_str);
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&check_nodes);
    }
    if (new_branches.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        new_branches.super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&check_nodes_str,
                 "The specified tapscript does not exist under this branch.",(allocator *)&hex);
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&check_nodes_str);
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    TapBranch(__return_storage_ptr__,
              new_branches.
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_start);
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
              (&new_branches);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&checked_nodes_size_list.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&target_branch_indexes.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    ::std::__cxx11::string::~string((string *)&reverse_nodes_str);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&reverse_nodes);
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
  return __return_storage_ptr__;
}

Assistant:

TapBranch TapBranch::ChangeTapLeaf(
    const Script& tapscript,
    const std::vector<ByteData256>& target_nodes) const {
  if (!IsFindTapScript(tapscript)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "This tapscript not exist in this tree.");
  }
  auto nodes = GetNodeList();
  if (has_leaf_ && script_.Equals(tapscript)) {
    if (target_nodes.empty() || (target_nodes == nodes)) return *this;
  }

  auto reverse_nodes = target_nodes;
  if (!reverse_nodes.empty()) {
    std::reverse(reverse_nodes.begin(), reverse_nodes.end());
  }
  std::string reverse_nodes_str;
  for (const auto& node : reverse_nodes) reverse_nodes_str += node.GetHex();

  std::vector<size_t> target_branch_indexes;
  std::vector<size_t> checked_nodes_size_list;

  std::vector<TapBranch> new_branches;
  for (size_t index = 0; index < branch_list_.size(); ++index) {
    const auto& branch = branch_list_[index];
    if (branch.IsFindTapScript(tapscript)) {
      std::vector<ByteData256> check_nodes;
      if (reverse_nodes.empty()) {
        target_branch_indexes.emplace_back(index);
        checked_nodes_size_list.emplace_back(0);
      } else {
        auto branch_nodes = branch.GetNodeList();
        for (size_t idx = nodes.size() - 1; idx > index; --idx) {
          check_nodes.emplace_back(nodes[idx]);
        }
        if (index == 0) {
          check_nodes.emplace_back(GetBaseHash());
        } else {
          check_nodes.emplace_back(
              GetBranchHash(static_cast<uint8_t>(index - 1)));
        }

        std::string check_nodes_str;
        for (const auto& node : check_nodes) {
          auto hex = node.GetHex();
          check_nodes_str += hex;
        }

        bool has_match = true;
        for (size_t idx = 0; idx < check_nodes.size(); ++idx) {
          if (!reverse_nodes[idx].Equals(check_nodes[idx])) {
            has_match = false;
            break;
          }
        }
        if (has_match) {
          target_branch_indexes.emplace_back(index);
          checked_nodes_size_list.emplace_back(check_nodes.size());
        }
      }
    }
  }

  for (size_t index = 0; index < target_branch_indexes.size(); ++index) {
    const auto& target_index = target_branch_indexes[index];
    const auto& checked_size = checked_nodes_size_list[index];
    std::vector<ByteData256> check_nodes;
    if (!target_nodes.empty()) {
      size_t copy_len = target_nodes.size() - checked_size;
      for (size_t idx = 0; idx < copy_len; ++idx) {
        check_nodes.emplace_back(target_nodes[idx]);
      }
    }

    try {
      auto new_branch =
          branch_list_[target_index].ChangeTapLeaf(tapscript, check_nodes);
      // ignore invalid target.
      if (new_branch.GetBaseHash().IsEmpty()) continue;

      auto based_branch = *this;
      std::vector<TapBranch> copy_branches;
      for (size_t idx = 0; idx < target_index; ++idx) {
        copy_branches.emplace_back(branch_list_[idx]);
      }
      based_branch.branch_list_ = copy_branches;

      new_branch.AddBranch(based_branch);
      for (size_t idx = target_index + 1; idx < branch_list_.size(); ++idx) {
        new_branch.AddBranch(branch_list_[idx]);
      }
      new_branches.emplace_back(new_branch);
    } catch (const CfdException&) {
      // target not found
    }
  }
  if (new_branches.empty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "The specified tapscript does not exist under this branch.");
  }
  return new_branches[0];  // response is top data.
}